

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

void __thiscall FxSoundCast::FxSoundCast(FxSoundCast *this,FxExpression *x)

{
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
  FScriptPosition::FScriptPosition(&(this->super_FxExpression).ScriptPosition,&x->ScriptPosition);
  (this->super_FxExpression).isresolved = false;
  (this->super_FxExpression).NeedResult = true;
  (this->super_FxExpression).ExprType = EFX_SoundCast;
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxSoundCast_0070b7b8;
  this->basex = x;
  (this->super_FxExpression).ValueType = (PType *)TypeSound;
  return;
}

Assistant:

FxSoundCast::FxSoundCast(FxExpression *x)
	: FxExpression(EFX_SoundCast, x->ScriptPosition)
{
	basex = x;
	ValueType = TypeSound;
}